

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<TPZFlopCounter>::Decompose_Cholesky
          (TPZMatrix<TPZFlopCounter> *this,list<long,_std::allocator<long>_> *singular)

{
  size_t *psVar1;
  list<long,_std::allocator<long>_> *plVar2;
  char cVar3;
  int iVar4;
  int extraout_var;
  _List_node_base *p_Var5;
  undefined8 in_R8;
  undefined8 in_R9;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  ulong extraout_XMM0_Qa_02;
  double __x;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  TPZFlopCounter tmp;
  double dVar8;
  double local_60;
  _List_node_base *local_58;
  double local_50;
  double local_48;
  _List_node_base *local_40;
  list<long,_std::allocator<long>_> *local_38;
  
  cVar3 = (this->super_TPZBaseMatrix).fDecomposed;
  local_38 = singular;
  if ((cVar3 != '\0') && (cVar3 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
    cVar3 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (cVar3 == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    local_58 = (_List_node_base *)CONCAT44(extraout_var,iVar4);
    if (local_58 != (_List_node_base *)0x0 && -1 < extraout_var) {
      p_Var6 = (_List_node_base *)0x0;
      do {
        if (p_Var6 != (_List_node_base *)0x0) {
          p_Var5 = (_List_node_base *)0x0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,p_Var6,p_Var6);
            dVar8 = extraout_XMM0_Qa;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,p_Var6,p_Var5);
            local_50 = extraout_XMM0_Qa_00;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,p_Var6,p_Var5);
            local_60 = dVar8 - extraout_XMM0_Qa_01 * local_50;
            TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
            TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,p_Var6,p_Var6,&local_60);
            p_Var5 = (_List_node_base *)((long)&p_Var5->_M_next + 1);
          } while (p_Var6 != p_Var5);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,p_Var6,p_Var6);
        if ((double)(extraout_XMM0_Qa_02 & (ulong)DAT_014d2320) <= 1e-12) {
          p_Var5 = (_List_node_base *)operator_new(0x18);
          plVar2 = local_38;
          p_Var5[1]._M_next = p_Var6;
          std::__detail::_List_node_base::_M_hook(p_Var5);
          psVar1 = &(plVar2->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          local_60 = 1.0;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,p_Var6,p_Var6,&local_60);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,p_Var6,p_Var6);
        if (__x < 0.0) {
          local_60 = sqrt(__x);
        }
        else {
          local_60 = SQRT(__x);
        }
        TPZFlopCounter::gCount.fCount[3] = TPZFlopCounter::gCount.fCount[3] + 1;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,p_Var6,p_Var6,&local_60);
        p_Var5 = (_List_node_base *)((long)&p_Var6->_M_next + 1);
        local_40 = p_Var5;
        if ((long)p_Var5 < (long)local_58) {
          do {
            if (p_Var6 != (_List_node_base *)0x0) {
              p_Var7 = (_List_node_base *)0x0;
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,p_Var6,p_Var5);
                dVar8 = extraout_XMM0_Qa_03;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,p_Var6,p_Var7);
                local_50 = extraout_XMM0_Qa_04;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,p_Var7,p_Var5);
                local_48 = dVar8 - extraout_XMM0_Qa_05 * local_50;
                TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
                TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (this,p_Var6,p_Var5,&local_48);
                p_Var7 = (_List_node_base *)((long)&p_Var7->_M_next + 1);
              } while (p_Var6 != p_Var7);
            }
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,p_Var6,p_Var6);
            if (ABS(extraout_XMM0_Qa_06) < 1e-12) {
              Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
            }
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,p_Var6,p_Var5);
            dVar8 = extraout_XMM0_Qa_07;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,p_Var6,p_Var6);
            TPZFlopCounter::gCount.fCount[2] = TPZFlopCounter::gCount.fCount[2] + 1;
            local_48 = dVar8 / extraout_XMM0_Qa_08;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,p_Var6,p_Var5,&local_48);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,p_Var6,p_Var5);
            local_48 = extraout_XMM0_Qa_09;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,p_Var5,p_Var6,&local_48,in_R8,in_R9,dVar8);
            p_Var5 = (_List_node_base *)((long)&p_Var5->_M_next + 1);
          } while ((long)p_Var5 < (long)local_58);
        }
        p_Var6 = local_40;
      } while (local_40 != local_58);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular) {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {             //elementos da diagonal
			PutVal( i,i,GetVal(i,i)-GetVal(i,k)*GetVal(i,k) );
		}
		if((fabs(GetVal(i,i))) <= fabs((TVar)1.e-12))
		{
			singular.push_back(i);
			PutVal(i,i,1.);
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {           //elementos fora da diagonal
            for(int64_t k=0; k<i; k++) {
                PutVal( i,j,GetVal(i,j)-GetVal(i,k)*GetVal(k,j) );
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            PutVal(j,i,GetVal(i,j));
			
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
}